

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KalmanFilter.cpp
# Opt level: O2

bool __thiscall iDynTree::DiscreteKalmanFilterHelper::kfInit(DiscreteKalmanFilterHelper *this)

{
  char *pcVar1;
  
  if (this->m_filter_constructed == false) {
    pcVar1 = "Please construct the filter first.";
  }
  else if ((this->m_measurement_noise_covariance_matrix_set == true) &&
          (this->m_system_noise_covariance_matrix_set != false)) {
    if ((this->m_initial_state_set == true) && (this->m_initial_state_covariance_set != false)) {
      this->m_is_initialized = true;
      return true;
    }
    pcVar1 = "Please set the initial state and the state covariance matrix.";
  }
  else {
    pcVar1 = "Please set the noise covariance matrices Q and R.";
  }
  iDynTree::reportError("DiscreteKalmanFilterHelper","kfInit",pcVar1);
  return false;
}

Assistant:

bool iDynTree::DiscreteKalmanFilterHelper::kfInit()
{
    if (!m_filter_constructed)
    {
        iDynTree::reportError("DiscreteKalmanFilterHelper", "kfInit", "Please construct the filter first.");
        return false;
    }

    if (!m_measurement_noise_covariance_matrix_set || !m_system_noise_covariance_matrix_set)
    {
        iDynTree::reportError("DiscreteKalmanFilterHelper", "kfInit", "Please set the noise covariance matrices Q and R.");
        return false;
    }

    if (!m_initial_state_set || !m_initial_state_covariance_set)
    {
        iDynTree::reportError("DiscreteKalmanFilterHelper", "kfInit", "Please set the initial state and the state covariance matrix.");
        return false;
    }

    m_is_initialized = true;
    return true;
}